

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall
SubcommandProgram_CallbackOrder_Test::~SubcommandProgram_CallbackOrder_Test
          (SubcommandProgram_CallbackOrder_Test *this)

{
  pointer pcVar1;
  
  (this->super_SubcommandProgram).super_TApp.super_Test._vptr_Test =
       (_func_int **)&PTR__SubcommandProgram_00178b70;
  pcVar1 = (this->super_SubcommandProgram).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SubcommandProgram).file.field_2) {
    operator_delete(pcVar1);
  }
  (this->super_SubcommandProgram).super_TApp.super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_00178158;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_SubcommandProgram).super_TApp.args);
  CLI::App::~App(&(this->super_SubcommandProgram).super_TApp.app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CallbackOrder) {
    std::vector<int> callback_order;
    start->set_callback([&callback_order]() { callback_order.push_back(1); });
    stop->set_callback([&callback_order]() { callback_order.push_back(2); });

    args = {"start", "stop"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({1, 2}));

    app.reset();
    callback_order.clear();

    args = {"stop", "start"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({2, 1}));
}